

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::completeOperation(Federate *this)

{
  Modes MVar1;
  long in_RDI;
  Federate *unaff_retaddr;
  Federate *in_stack_00000020;
  Federate *in_stack_00000028;
  Federate *in_stack_00000048;
  Federate *in_stack_00000060;
  
  MVar1 = CLI::std::atomic<helics::Federate::Modes>::load
                    ((atomic<helics::Federate::Modes> *)(in_RDI + 8),seq_cst);
  switch(MVar1) {
  case PENDING_INIT:
    enterInitializingModeComplete(in_stack_00000020);
    break;
  case PENDING_EXEC:
    enterExecutingModeComplete(in_stack_00000048);
    break;
  case PENDING_TIME:
    requestTimeComplete(in_stack_00000028);
    break;
  case PENDING_ITERATIVE_TIME:
    requestTimeIterativeComplete(in_stack_00000060);
    break;
  case PENDING_FINALIZE:
    finalizeComplete(unaff_retaddr);
  }
  return;
}

Assistant:

void Federate::completeOperation()
{
    switch (currentMode.load()) {
        case Modes::PENDING_INIT:
            enterInitializingModeComplete();
            break;
        case Modes::PENDING_EXEC:
            enterExecutingModeComplete();
            break;
        case Modes::PENDING_TIME:
            requestTimeComplete();
            break;
        case Modes::PENDING_ITERATIVE_TIME:
            requestTimeIterativeComplete();
            break;
        case Modes::PENDING_FINALIZE:
            finalizeComplete();
            break;
        default:
            break;
    }
}